

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::BeginClass(StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  
  local_20 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  if ((struct_def->fixed & 1U) == 0) {
    std::operator+(&local_b0,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_90,&local_b0," extends Table\n");
    std::__cxx11::string::operator+=((string *)local_20,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    std::operator+(&local_60,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_40,&local_60," extends Struct\n");
    std::__cxx11::string::operator+=((string *)local_20,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::operator+=((string *)local_20,"{\n");
  return;
}

Assistant:

static void BeginClass(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    if (struct_def.fixed) {
      code += "class " + struct_def.name + " extends Struct\n";
    } else {
      code += "class " + struct_def.name + " extends Table\n";
    }
    code += "{\n";
  }